

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

tmbstr GetAllowedValues(TidyOption topt,OptionDesc *d)

{
  size_t sVar1;
  tmbstr val;
  OptionDesc *d_local;
  TidyOption topt_local;
  
  if (d->vals == (ctmbstr)0x0) {
    topt_local = (TidyOption)GetAllowedValuesFromPick(topt);
  }
  else {
    sVar1 = strlen(d->vals);
    topt_local = (TidyOption)malloc(sVar1 + 1);
    if (topt_local == (TidyOption)0x0) {
      outOfMemory();
    }
    strcpy((char *)topt_local,d->vals);
  }
  return (tmbstr)topt_local;
}

Assistant:

static tmbstr GetAllowedValues(TidyOption topt,    /**< A TidyOption for which to get the allowed values. */
                               const OptionDesc *d /**< A pointer to the OptionDesc array. */
                               )
{
    if (d->vals)
    {
        tmbstr val = (tmbstr)malloc(1+strlen(d->vals));
        if (!val) outOfMemory();
        strcpy(val, d->vals);
        return val;
    }
    else
        return GetAllowedValuesFromPick( topt );
}